

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3RunnerNonRecursive.hpp
# Opt level: O2

semantic_value_type __thiscall Centaurus::Stage3Runner::reduce(Stage3Runner *this)

{
  _Head_base<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false> *values;
  StackEntryTag n;
  _Tuple_impl<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
  *this_00;
  _Tuple_impl<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
  *this_01;
  pointer pSVar1;
  pointer puVar2;
  pointer puVar3;
  uint __line;
  undefined8 *puVar4;
  pointer pSVar5;
  char *__assertion;
  pointer marker;
  pointer marker_00;
  CSTMarker *pCVar6;
  unsigned_long uVar7;
  iterator values_next_it;
  
  puVar4 = (undefined8 *)acquire_bank(this);
  if (puVar4 == (undefined8 *)0x0) {
    __assertion = "bank_base_ptr != nullptr";
    __line = 0x34;
  }
  else {
    this_00 = (_Tuple_impl<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
               *)*puVar4;
    if ((long)this->m_current_bank != -1) {
      LOCK();
      *(undefined4 *)
       ((long)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window +
       (long)this->m_current_bank * 8 + 4) = 0;
      UNLOCK();
      this->m_current_bank = -1;
    }
    values = &(this_00->
              super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
              ).
              super__Tuple_impl<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
              .
              super__Head_base<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>
    ;
    while( true ) {
      puVar4 = (undefined8 *)acquire_bank(this);
      if (puVar4 == (undefined8 *)0x0) break;
      this_01 = (_Tuple_impl<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                 *)*puVar4;
      values_next_it._M_current =
           (this_01->
           super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
           ).
           super__Tuple_impl<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
           .super__Head_base<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>
           ._M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      marker = (this_01->
               super__Head_base<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
               )._M_head_impl.
               super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar1 = *(pointer *)
                ((long)&(this_01->
                        super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                        ).
                        super__Tuple_impl<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                        .
                        super__Tuple_impl<3UL,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                        .
                        super__Head_base<3UL,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>,_false>
                        ._M_head_impl.
                        super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                        ._M_impl + 8);
      marker_00 = (this_01->
                  super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                  ).
                  super__Head_base<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      for (pSVar5 = *(pointer *)
                     &(this_01->
                      super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                      ).
                      super__Tuple_impl<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                      .
                      super__Tuple_impl<3UL,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                      .
                      super__Head_base<3UL,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                      ._M_impl; pSVar5 != pSVar1; pSVar5 = pSVar5 + 1) {
        n = *pSVar5;
        if (n == END_MARKER) {
          if ((this_00->
              super__Head_base<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
              )._M_head_impl.
              super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              (this_00->
              super__Head_base<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
              )._M_head_impl.
              super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            __assertion = "!starts.empty()";
            __line = 0x58;
            goto LAB_00119159;
          }
          pCVar6 = marker_00 + 1;
          NonRecursiveReductionRunner::reduce_by_end_marker
                    (&this->super_NonRecursiveReductionRunner,marker_00,
                     &(this_00->
                      super__Head_base<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
                      )._M_head_impl,&values->_M_head_impl,
                     (vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                      *)this_00);
        }
        else {
          pCVar6 = marker_00;
          if (n == START_MARKER) {
            NonRecursiveReductionRunner::push_start_marker
                      (marker,&(this_00->
                               super__Head_base<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
                               )._M_head_impl,
                       (vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                        *)this_00);
            marker = marker + 1;
          }
          else {
            if (n < VALUE) {
              __assertion = "detail::isValueTag(cur_tag)";
              __line = 0x5c;
              goto LAB_00119159;
            }
            append_value<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (&values_next_it,n,&values->_M_head_impl,
                       (vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                        *)this_00);
          }
        }
        marker_00 = pCVar6;
      }
      if (marker != (this_01->
                    super__Head_base<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
                    )._M_head_impl.
                    super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        __assertion = "starts_next_it == starts_next.end()";
        __line = 0x61;
        goto LAB_00119159;
      }
      if (marker_00 !=
          (this_01->
          super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
          ).
          super__Head_base<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
          ._M_head_impl.
          super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __assertion = "ends_next_it == ends_next.end()";
        __line = 0x62;
        goto LAB_00119159;
      }
      if (values_next_it._M_current !=
          *(pointer *)
           ((long)&(this_01->
                   super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                   ).
                   super__Tuple_impl<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                   .
                   super__Head_base<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>
                   ._M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data + 8)) {
        __assertion = "values_next_it == values_next.end()";
        __line = 100;
        goto LAB_00119159;
      }
      std::
      _Tuple_impl<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
      ::~_Tuple_impl(this_01);
      operator_delete(this_01);
      if ((long)this->m_current_bank != -1) {
        LOCK();
        *(undefined4 *)
         ((long)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window +
         (long)this->m_current_bank * 8 + 4) = 0;
        UNLOCK();
        this->m_current_bank = -1;
      }
    }
    if ((this_00->
        super__Head_base<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
        )._M_head_impl.
        super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this_00->
        super__Head_base<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
        )._M_head_impl.
        super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((this_00->
          super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
          ).
          super__Head_base<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
          ._M_head_impl.
          super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this_00->
          super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
          ).
          super__Head_base<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_false>
          ._M_head_impl.
          super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar2 = *(pointer *)
                  ((long)&(this_00->
                          super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                          ).
                          super__Tuple_impl<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                          .
                          super__Head_base<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + 8);
        puVar3 = (this_00->
                 super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                 ).
                 super__Tuple_impl<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                 .
                 super__Head_base<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>
                 ._M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)puVar2 - (long)puVar3) < 9) {
          if ((ulong)((long)*(pointer *)
                             ((long)&(this_00->
                                     super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                                     ).
                                     super__Tuple_impl<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                                     .
                                     super__Tuple_impl<3UL,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                                     .
                                     super__Head_base<3UL,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>,_false>
                                     ._M_head_impl.
                                     super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                                     ._M_impl + 8) -
                     *(long *)&(this_00->
                               super__Tuple_impl<1UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                               ).
                               super__Tuple_impl<2UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                               .
                               super__Tuple_impl<3UL,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                               .
                               super__Head_base<3UL,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>,_false>
                               ._M_head_impl.
                               super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                               ._M_impl) < 5) {
            if (puVar3 == puVar2) {
              uVar7 = 0;
            }
            else {
              uVar7 = *puVar3;
            }
            std::
            _Tuple_impl<0UL,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
            ::~_Tuple_impl(this_00);
            operator_delete(this_00);
            return uVar7;
          }
          __assertion = "tags.size() <= 1";
          __line = 0x6e;
        }
        else {
          __assertion = "values.size() <= 1";
          __line = 0x6d;
        }
      }
      else {
        __assertion = "ends.empty()";
        __line = 0x6c;
      }
    }
    else {
      __assertion = "starts.empty()";
      __line = 0x6b;
    }
  }
LAB_00119159:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                ,__line,"semantic_value_type Centaurus::Stage3Runner::reduce()");
}

Assistant:

semantic_value_type reduce()
  {
#if PYCENTAURUS
    auto bank_ptr = reinterpret_cast<uint64_t*>(acquire_bank());
    assert(bank_ptr != nullptr);
    std::vector<CSTMarker> starts(*bank_ptr++, CSTMarker(0));
    std::memcpy(starts.data(), bank_ptr, starts.size()*sizeof(CSTMarker));
    bank_ptr += starts.size();
    std::vector<CSTMarker> ends(*bank_ptr++, CSTMarker(0));
    assert(ends.empty());
    std::vector<semantic_value_type> values(*bank_ptr++);
    std::memcpy(values.data(), bank_ptr, values.size()*sizeof(semantic_value_type));
    assert(values[0] == 0 && values.size() == 1);
    bank_ptr += values.size();
    std::vector<detail::StackEntryTag> tags(*bank_ptr++);
    std::memcpy(tags.data(), bank_ptr, tags.size()*sizeof(detail::StackEntryTag));
#else
    auto bank_base_ptr = reinterpret_cast<std::tuple<std::vector<CSTMarker>,
                                                     std::vector<CSTMarker>,
                                                     std::vector<semantic_value_type>,
                                                     std::vector<detail::StackEntryTag>>**>(acquire_bank());
    assert(bank_base_ptr != nullptr);
    auto& stack_tuple_base = **bank_base_ptr;
    auto& starts = std::get<0>(stack_tuple_base);
    auto& ends   = std::get<1>(stack_tuple_base);
    auto& values = std::get<2>(stack_tuple_base);
    auto& tags   = std::get<3>(stack_tuple_base);
#endif
    release_bank();

    void *current_bank;
    while ((current_bank = acquire_bank()) != nullptr) {
#if PYCENTAURUS
      auto bank_ptr = reinterpret_cast<uint64_t*>(current_bank);
      detail::ConstPtrRange<CSTMarker> starts_next(reinterpret_cast<CSTMarker*>(bank_ptr + 1), bank_ptr[0]);
      bank_ptr += starts_next.size() + 1;
      detail::ConstPtrRange<CSTMarker> ends_next(reinterpret_cast<CSTMarker*>(bank_ptr + 1), bank_ptr[0]);
      bank_ptr += ends_next.size() + 1;
      detail::ConstPtrRange<semantic_value_type> values_next(bank_ptr + 1, bank_ptr[0]);
      bank_ptr += values_next.size() + 1;
      detail::ConstPtrRange<detail::StackEntryTag> tags_next(reinterpret_cast<detail::StackEntryTag*>(bank_ptr + 1), bank_ptr[0]);
#else
      auto& stack_tuple = **reinterpret_cast<std::decay<decltype(stack_tuple_base)>::type**>(current_bank);
      auto& starts_next = std::get<0>(stack_tuple);
      auto& ends_next   = std::get<1>(stack_tuple);
      auto& values_next = std::get<2>(stack_tuple);
      auto& tags_next   = std::get<3>(stack_tuple);
#endif
      auto starts_next_it = starts_next.begin();
      auto ends_next_it   = ends_next.begin();
      auto values_next_it = values_next.begin();
      for (auto cur_tag : tags_next) {
        switch (cur_tag) {
        case detail::StackEntryTag::START_MARKER:
          push_start_marker(*starts_next_it++, starts, tags);
          break;
        case detail::StackEntryTag::END_MARKER: {
          assert(!starts.empty());
          reduce_by_end_marker(*ends_next_it++, starts, values, tags);
        } break;
        default:
          assert(detail::isValueTag(cur_tag));
          append_value(values_next_it, static_cast<int>(cur_tag), values, tags);
          break;
        }
      }
      assert(starts_next_it == starts_next.end());
      assert(ends_next_it == ends_next.end());
#if !PYCENTAURUS
      assert(values_next_it == values_next.end());
#endif
#if !PYCENTAURUS
      delete &stack_tuple;
#endif
      release_bank();
    }
    assert(starts.empty());
    assert(ends.empty());
    assert(values.size() <= 1);
    assert(tags.size() <= 1);

    auto result = (values.empty()) ? 0 : std::move(values.front());
#if !PYCENTAURUS
    delete &stack_tuple_base;
#endif
    return result;
  }